

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_clone_noMemoryAvailable_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_80;
  AString *pAStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 0x29a;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14ddf9;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x29b);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234567",9);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  uStack_50 = 0x14de32;
  pAVar2 = AString_clone(&string);
  if (pAVar2 != (AString *)0x0) {
    expr = "Assertion \'_ck_x == NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) cloned == NULL";
    pcVar7 = "(void*) cloned";
    iVar1 = 0x970;
    ppcVar5 = (char **)&uStack_50;
    goto LAB_0014e03c;
  }
  uStack_50 = 0x14de4c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x970);
  if (string.capacity == 0x29a) {
    uStack_50 = 0x14de6f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x971);
    if (string.buffer == (char *)0x0) {
      local_58 = (char *)0x0;
      uStack_50 = 0;
      pcStack_60 = (char *)0x14dfa0;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x971,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                        "(void*) (string).buffer");
    }
    uStack_50 = 0x14de8c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x971);
    pcVar4 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pAVar2 = (AString *)0x1671cb;
      pcVar4 = "(null)";
    }
    else {
      uStack_50 = 0x14dea9;
      iVar1 = strcmp("01234567",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x14dec2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x971);
        if (string.size == 8) {
          uStack_50 = 0x14dee2;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x971);
          uStack_50 = 0x14deeb;
          (*string.deallocator)(string.buffer);
          return;
        }
        pcStack_60 = "strlen(\"01234567\")";
        pcVar6 = "(string).size == strlen(\"01234567\")";
        pcVar7 = "(string).size";
        local_58 = (char *)0x8;
        pAVar2 = (AString *)string.size;
        goto LAB_0014e03a;
      }
      pAVar2 = (AString *)0x15b593;
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar6 = "(string).buffer == (\"01234567\")";
    pcVar7 = "(string).buffer";
    iVar1 = 0x971;
    local_58 = "\"";
    pcStack_60 = "01234567";
    pcStack_68 = "\"";
    pcStack_70 = "(\"01234567\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar4;
    pAStack_78 = pAVar2;
  }
  else {
    pcStack_60 = "(666)";
    pcVar6 = "(string).capacity == (666)";
    pcVar7 = "(string).capacity";
    local_58 = (char *)0x29a;
    pAVar2 = (AString *)string.capacity;
LAB_0014e03a:
    iVar1 = 0x971;
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &pcStack_60;
  }
LAB_0014e03c:
  uStack_50 = 0;
  *(AString **)((long)ppcVar5 + -8) = pAVar2;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_clone_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}